

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall
client_socket::client_socket
          (client_socket *this,epoll *ep,file_descriptor *fd,on_ready_t *on_disconnect,
          on_ready_t *on_read_ready,on_ready_t *on_write_ready)

{
  file_descriptor *ep_00;
  impl *this_00;
  function<void_()> local_a0;
  function<void_()> local_80;
  function<void_()> local_60;
  file_descriptor local_3c;
  on_ready_t *local_38;
  on_ready_t *on_write_ready_local;
  on_ready_t *on_read_ready_local;
  on_ready_t *on_disconnect_local;
  file_descriptor *fd_local;
  epoll *ep_local;
  client_socket *this_local;
  
  local_38 = on_write_ready;
  on_write_ready_local = on_read_ready;
  on_read_ready_local = on_disconnect;
  on_disconnect_local = (on_ready_t *)fd;
  fd_local = &ep->fd_;
  ep_local = (epoll *)this;
  this_00 = (impl *)operator_new(0xa8);
  ep_00 = fd_local;
  file_descriptor::file_descriptor(&local_3c,fd);
  std::function<void_()>::function(&local_60,on_disconnect);
  std::function<void_()>::function(&local_80,on_read_ready);
  std::function<void_()>::function(&local_a0,on_write_ready);
  impl::impl(this_00,(epoll *)ep_00,&local_3c,&local_60,&local_80,&local_a0);
  std::unique_ptr<client_socket::impl,std::default_delete<client_socket::impl>>::
  unique_ptr<std::default_delete<client_socket::impl>,void>
            ((unique_ptr<client_socket::impl,std::default_delete<client_socket::impl>> *)this,
             this_00);
  std::function<void_()>::~function(&local_a0);
  std::function<void_()>::~function(&local_80);
  std::function<void_()>::~function(&local_60);
  file_descriptor::~file_descriptor(&local_3c);
  return;
}

Assistant:

client_socket::client_socket(epoll& ep,
                             file_descriptor fd,
                             on_ready_t on_disconnect,
                             on_ready_t on_read_ready,
                             on_ready_t on_write_ready)
    : pimpl(new impl(ep, std::move(fd), std::move(on_disconnect), std::move(on_read_ready), std::move(on_write_ready)))
{}